

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O2

void __thiscall crypto_tests::sha1_testvectors::test_method(sha1_testvectors *this)

{
  long in_FS_OFFSET;
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"da39a3ee5e6b4b0d3255bfef95601890afd80709",&local_52);
  CryptoTest::TestSHA1(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"abc",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"a9993e364706816aba3e25717850c26c9cd0d89d",&local_52);
  CryptoTest::TestSHA1(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"message digest",&local_51)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"c12252ceda8be8994d5fa0290a47231c1d16aae3",&local_52);
  CryptoTest::TestSHA1(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"secure hash algorithm",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"d4d6d2f0ebe317513bbd8d967d89bac5819c2f60",&local_52);
  CryptoTest::TestSHA1(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"SHA1 is considered to be safe",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"f2b6650569ad3a8720348dd6ea6c497dee3a842a",&local_52);
  CryptoTest::TestSHA1(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",
             &local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"84983e441c3bd26ebaae4aa1f95129e5e54670f1",&local_52);
  CryptoTest::TestSHA1(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"For this sample, this 63-byte string will be used as input data",
             &local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"4f0ea5cd0585a23d028abdc1a6684e5a8094dc49",&local_52);
  CryptoTest::TestSHA1(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"This is exactly 64 bytes long, not counting the terminating byte",
             &local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"fb679f23e7d1ce053313e66e127ab1b444397057",&local_52);
  CryptoTest::TestSHA1(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_30,1000000,'a');
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"34aa973cd4c4daa4f61eeb2bdbad27316534016f",&local_51);
  CryptoTest::TestSHA1(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"b7755760681cbfd971451668f32af5774f4656b5",
             (allocator<char> *)&local_50);
  CryptoTest::TestSHA1(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&test1_abi_cxx11_,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(sha1_testvectors) {
    TestSHA1("", "da39a3ee5e6b4b0d3255bfef95601890afd80709");
    TestSHA1("abc", "a9993e364706816aba3e25717850c26c9cd0d89d");
    TestSHA1("message digest", "c12252ceda8be8994d5fa0290a47231c1d16aae3");
    TestSHA1("secure hash algorithm", "d4d6d2f0ebe317513bbd8d967d89bac5819c2f60");
    TestSHA1("SHA1 is considered to be safe", "f2b6650569ad3a8720348dd6ea6c497dee3a842a");
    TestSHA1("abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",
             "84983e441c3bd26ebaae4aa1f95129e5e54670f1");
    TestSHA1("For this sample, this 63-byte string will be used as input data",
             "4f0ea5cd0585a23d028abdc1a6684e5a8094dc49");
    TestSHA1("This is exactly 64 bytes long, not counting the terminating byte",
             "fb679f23e7d1ce053313e66e127ab1b444397057");
    TestSHA1(std::string(1000000, 'a'), "34aa973cd4c4daa4f61eeb2bdbad27316534016f");
    TestSHA1(test1, "b7755760681cbfd971451668f32af5774f4656b5");
}